

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FlowGraph.cpp
# Opt level: O1

void __thiscall BasicBlock::InvertBranch(BasicBlock *this,BranchInstr *branch)

{
  BasicBlock *pBVar1;
  Type pSVar2;
  SListBaseCounted<FlowEdge_*,_Memory::ArenaAllocator> *pSVar3;
  code *pcVar4;
  SListBaseCounted<FlowEdge_*,_Memory::ArenaAllocator> *pSVar5;
  SListBaseCounted<FlowEdge_*,_Memory::ArenaAllocator> *pSVar6;
  bool bVar7;
  undefined4 *puVar8;
  Func **ppFVar9;
  long lVar10;
  SListBaseCounted<FlowEdge_*,_Memory::ArenaAllocator> *pSVar11;
  
  pBVar1 = this->next;
  ppFVar9 = (Func **)&pBVar1->firstInstr;
  if (pBVar1 == (BasicBlock *)0x0) {
    ppFVar9 = &this->func;
  }
  lVar10 = 0x18;
  if (pBVar1 == (BasicBlock *)0x0) {
    lVar10 = 0xd0;
  }
  if (*(BranchInstr **)((long)&(*ppFVar9)->m_alloc + lVar10) != branch) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar8 = 1;
    bVar7 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                       ,0x49c,"(this->GetLastInstr() == branch)","this->GetLastInstr() == branch");
    if (!bVar7) goto LAB_0041b87f;
    *puVar8 = 0;
  }
  pSVar2 = (this->succList).super_SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>.
           super_SListNodeBase<Memory::ArenaAllocator>.next;
  pSVar11 = &this->succList;
  if (((SListBaseCounted<FlowEdge_*,_Memory::ArenaAllocator> *)pSVar2 == pSVar11) ||
     ((SListBaseCounted<FlowEdge_*,_Memory::ArenaAllocator> *)pSVar2->next->next != pSVar11)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar8 = 1;
    bVar7 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                       ,0x49d,"(this->GetSuccList()->HasTwo())","this->GetSuccList()->HasTwo()");
    if (!bVar7) {
LAB_0041b87f:
      pcVar4 = (code *)invalidInstructionException();
      (*pcVar4)();
    }
    *puVar8 = 0;
  }
  IR::BranchInstr::Invert(branch);
  pSVar5 = pSVar11;
  pSVar6 = (SListBaseCounted<FlowEdge_*,_Memory::ArenaAllocator> *)
           (pSVar11->super_SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>).
           super_SListNodeBase<Memory::ArenaAllocator>.next;
  while (pSVar6 != pSVar11) {
    pSVar3 = (SListBaseCounted<FlowEdge_*,_Memory::ArenaAllocator> *)
             (pSVar6->super_SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>).
             super_SListNodeBase<Memory::ArenaAllocator>.next;
    (pSVar6->super_SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>).
    super_SListNodeBase<Memory::ArenaAllocator>.next = (Type)pSVar5;
    pSVar5 = pSVar6;
    pSVar6 = pSVar3;
  }
  (pSVar6->super_SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>).
  super_SListNodeBase<Memory::ArenaAllocator>.next = (Type)pSVar5;
  return;
}

Assistant:

void
BasicBlock::InvertBranch(IR::BranchInstr *branch)
{
    Assert(this->GetLastInstr() == branch);
    Assert(this->GetSuccList()->HasTwo());

    branch->Invert();
    this->GetSuccList()->Reverse();
}